

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

object_ptr __thiscall mjs::global_object_impl::to_object(global_object_impl *this,value *v)

{
  gc_heap *this_00;
  native_error_exception *this_01;
  wostream *pwVar1;
  char *pcVar2;
  value_type *in_RDX;
  value_type *extraout_RDX;
  value_type *extraout_RDX_00;
  object_ptr oVar3;
  wostringstream woss;
  wstring local_1f8;
  wstring_view local_1d8 [2];
  wstring_view local_1b8;
  wstring_view local_1a8;
  global_object_impl local_198 [2];
  
  switch(*in_RDX) {
  case undefined:
  case null:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_198);
    pwVar1 = std::operator<<((wostream *)local_198,"Cannot convert ");
    pcVar2 = string_value(*in_RDX);
    pwVar1 = std::operator<<(pwVar1,pcVar2);
    std::operator<<(pwVar1," to object");
    this_01 = (native_error_exception *)__cxa_allocate_exception(0x58);
    global_object::stack_trace_abi_cxx11_(&local_1f8,(global_object *)v);
    local_1b8._M_len = local_1f8._M_string_length;
    local_1b8._M_str = local_1f8._M_dataplus._M_p;
    std::__cxx11::wstringbuf::str();
    local_1a8._M_len = (size_t)local_1d8[0]._M_str;
    local_1a8._M_str = (wchar_t *)local_1d8[0]._M_len;
    native_error_exception::native_error_exception(this_01,type,&local_1b8,&local_1a8);
    __cxa_throw(this_01,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  case boolean:
    gc_heap::unsafe_create_from_position<mjs::object>
              ((gc_heap *)local_198,(uint32_t)*(undefined8 *)&v->field_1);
    if (*in_RDX != boolean) {
      __assert_fail("type_ == value_type::boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x43,"bool mjs::value::boolean_value() const");
    }
    new_boolean((object_ptr *)this,SUB81(local_198,0));
    break;
  case number:
    gc_heap::unsafe_create_from_position<mjs::object>
              ((gc_heap *)local_198,(uint32_t)*(undefined8 *)&v->field_1);
    if (*in_RDX != number) {
      __assert_fail("type_ == value_type::number",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x44,"double mjs::value::number_value() const");
    }
    new_number((mjs *)this,(object_ptr *)local_198,*(double *)(in_RDX + 2));
    break;
  case string:
    self_ptr(local_198);
    if (*in_RDX != string) {
      __assert_fail("type_ == value_type::string",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x45,"const string &mjs::value::string_value() const");
    }
    new_string((mjs *)this,(gc_heap_ptr<mjs::global_object> *)local_198,(string *)(in_RDX + 2));
    break;
  case object:
    this_00 = *(gc_heap **)(in_RDX + 2);
    (this->super_global_object).super_object._vptr_object = (_func_int **)this_00;
    *(value_type *)&(this->super_global_object).super_object.heap_ = in_RDX[4];
    if (this_00 != (gc_heap *)0x0) {
      gc_heap::attach(this_00,(gc_heap_ptr_untyped *)this);
      in_RDX = extraout_RDX;
    }
    goto LAB_0014795b;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_198);
    pwVar1 = std::operator<<((wostream *)local_198,"Not implemented: ");
    pcVar2 = string_value(*in_RDX);
    std::operator<<(pwVar1,pcVar2);
    std::__cxx11::wstringbuf::str();
    local_1d8[0]._M_len = local_1f8._M_string_length;
    local_1d8[0]._M_str = local_1f8._M_dataplus._M_p;
    throw_runtime_error(local_1d8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                        ,0x244);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_198);
  in_RDX = extraout_RDX_00;
LAB_0014795b:
  oVar3.super_gc_heap_ptr_untyped._8_8_ = in_RDX;
  oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr to_object(const value& v) override {
        switch (v.type()) {
            // undefined and null give runtime errors
        case value_type::undefined:
        case value_type::null:
            {
                std::wostringstream woss;
                woss << "Cannot convert " << v.type() << " to object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
        case value_type::boolean: return new_boolean(boolean_prototype_.track(heap()), v.boolean_value());
        case value_type::number:  return new_number(number_prototype_.track(heap()), v.number_value());
        case value_type::string:  return new_string(self_ptr(), v.string_value());
        case value_type::object:  return v.object_value();
        default:
            NOT_IMPLEMENTED(v.type());
        }
    }